

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounds.h
# Opt level: O2

ostream * libDAI::operator<<(ostream *os,BoundTreeNode *n)

{
  char *pcVar1;
  ostream *poVar2;
  Exception *this;
  allocator<char> local_39;
  string local_38;
  
  if (n->_type == VAR) {
    pcVar1 = "\tv";
  }
  else {
    if (n->_type != FACTOR) {
      this = (Exception *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"./bounds.h, line 55",&local_39);
      Exception::Exception(this,4,&local_38);
      __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar1 = "\tf";
  }
  poVar2 = std::operator<<(os,pcVar1 + 1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  return poVar2;
}

Assistant:

std::ostream& operator << (std::ostream& os, const BoundTreeNode& n) { 
                if( n._type == BoundTreeNode::VAR )
                    return( os << "v" << n._id ); 
                else if( n._type == BoundTreeNode::FACTOR ) 
                    return( os << "f" << n._id ); 
                else
                    DAI_THROW(UNKNOWN_ENUM_VALUE);
            }